

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

RsRuleSyntax * __thiscall slang::parsing::Parser::parseRsRule(Parser *this)

{
  span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> elements;
  Token colonEqual_00;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *expression;
  size_type sVar3;
  reference ppRVar4;
  undefined4 extraout_var;
  RsRuleSyntax *pRVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_01;
  Token join_00;
  Token openParen_00;
  Token closeParen_00;
  SourceRange SVar6;
  Token TVar7;
  SyntaxList<slang::syntax::RsProdSyntax> local_1e8;
  ExpressionSyntax *local_1b8;
  Token TStack_1b0;
  RsCodeBlockSyntax *codeBlock;
  ExpressionSyntax *local_198;
  ExpressionSyntax *weight;
  Token colonEqual;
  RsWeightClauseSyntax *weightClause;
  Token local_160;
  SourceRange local_150;
  SourceLocation local_140;
  SourceLocation local_138;
  SourceRange local_130;
  undefined1 auStack_120 [8];
  SourceRange range;
  SyntaxNode *local_f0;
  RsProdSyntax *prod;
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL> prods;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  ParenthesizedExpressionSyntax *parenExpr;
  Token join;
  Token rand;
  RandJoinClauseSyntax *randJoin;
  Parser *this_local;
  
  rand.info = (Info *)0x0;
  bVar1 = ParserBase::peek(&this->super_ParserBase,RandKeyword);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    join_00 = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
    openParen.info = (Info *)0x0;
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      openParen_00 = ParserBase::consume(&this->super_ParserBase);
      expression = parseExpression(this);
      closeParen_00 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      openParen.info =
           (Info *)slang::syntax::SyntaxFactory::parenthesizedExpression
                             (&this->factory,openParen_00,expression,closeParen_00);
    }
    parenExpr = join_00._0_8_;
    prods.stackBase._24_8_ = parenExpr;
    rand.info = (Info *)slang::syntax::SyntaxFactory::randJoinClause
                                  (&this->factory,TVar7,join_00,
                                   (ParenthesizedExpressionSyntax *)openParen.info);
  }
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::RsProdSyntax_*,_5UL> *)&prod);
  while( true ) {
    local_f0 = &parseRsProd(this)->super_SyntaxNode;
    TVar7.info = local_160.info;
    TVar7.kind = local_160.kind;
    TVar7._2_1_ = local_160._2_1_;
    TVar7.numFlags.raw = local_160.numFlags.raw;
    TVar7.rawLen = local_160.rawLen;
    if (local_f0 == (SyntaxNode *)0x0) break;
    SmallVectorBase<slang::syntax::RsProdSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)&prod,(RsProdSyntax **)&local_f0);
    if ((rand.info != (Info *)0x0) && (local_f0->kind != RsProdItem)) {
      SVar6 = slang::syntax::SyntaxNode::sourceRange(local_f0);
      range.endLoc = SVar6.startLoc;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x800005,SVar6);
    }
  }
  if (rand.info != (Info *)0x0) {
    sVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::size
                      ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)&prod);
    TVar7.info = local_160.info;
    TVar7.kind = local_160.kind;
    TVar7._2_1_ = local_160._2_1_;
    TVar7.numFlags.raw = local_160.numFlags.raw;
    TVar7.rawLen = local_160.rawLen;
    if (sVar3 < 2) {
      SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)rand.info);
      range.startLoc = SVar6.endLoc;
      auStack_120 = (undefined1  [8])SVar6.startLoc;
      bVar1 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::empty
                        ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)&prod);
      if (!bVar1) {
        local_138 = SourceRange::start((SourceRange *)auStack_120);
        ppRVar4 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::back
                            ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)&prod);
        local_160 = slang::syntax::SyntaxNode::getLastToken(&(*ppRVar4)->super_SyntaxNode);
        local_150 = Token::range(&local_160);
        local_140 = SourceRange::end(&local_150);
        SourceRange::SourceRange(&local_130,local_138,local_140);
        auStack_120 = (undefined1  [8])local_130.startLoc;
        range.startLoc = local_130.endLoc;
      }
      SVar6.endLoc = range.startLoc;
      SVar6.startLoc = (SourceLocation)auStack_120;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar6);
      TVar7 = local_160;
    }
  }
  colonEqual.info = (Info *)0x0;
  local_160 = TVar7;
  bVar1 = ParserBase::peek(&this->super_ParserBase,ColonEquals);
  src = extraout_RDX;
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    colonEqual._0_8_ = TVar7.info;
    weight = TVar7._0_8_;
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
              ((bitmask<slang::parsing::detail::ExpressionOptions> *)((long)&codeBlock + 4),
               DisallowVectors);
    local_198 = parsePrimaryExpression(this,codeBlock._4_4_);
    TStack_1b0.info = (Info *)0x0;
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
    if (bVar1) {
      TStack_1b0.info = (Info *)parseRsCodeBlock(this);
    }
    local_1b8 = weight;
    TStack_1b0.kind = colonEqual.kind;
    TStack_1b0._2_1_ = colonEqual._2_1_;
    TStack_1b0.numFlags.raw = colonEqual.numFlags.raw;
    TStack_1b0.rawLen = colonEqual.rawLen;
    colonEqual_00.info = (Info *)colonEqual._0_8_;
    colonEqual_00._0_8_ = weight;
    colonEqual.info =
         (Info *)slang::syntax::SyntaxFactory::rsWeightClause
                           (&this->factory,colonEqual_00,local_198,(RsProdSyntax *)TStack_1b0.info);
    src = extraout_RDX_00;
  }
  iVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)&prod,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  elements.data_._4_4_ = extraout_var;
  elements.data_._0_4_ = iVar2;
  elements.size_ = extraout_RDX_01;
  slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>::SyntaxList(&local_1e8,elements);
  pRVar5 = slang::syntax::SyntaxFactory::rsRule
                     (&this->factory,(RandJoinClauseSyntax *)rand.info,&local_1e8,
                      (RsWeightClauseSyntax *)colonEqual.info);
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::RsProdSyntax_*,_5UL> *)&prod);
  return pRVar5;
}

Assistant:

RsRuleSyntax& Parser::parseRsRule() {
    RandJoinClauseSyntax* randJoin = nullptr;
    if (peek(TokenKind::RandKeyword)) {
        auto rand = consume();
        auto join = expect(TokenKind::JoinKeyword);

        ParenthesizedExpressionSyntax* parenExpr = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            parenExpr = &factory.parenthesizedExpression(openParen, expr, closeParen);
        }

        randJoin = &factory.randJoinClause(rand, join, parenExpr);
    }

    SmallVector<RsProdSyntax*> prods;
    while (true) {
        auto prod = parseRsProd();
        if (!prod)
            break;

        prods.push_back(prod);
        if (randJoin && prod->kind != SyntaxKind::RsProdItem)
            addDiag(diag::RandJoinProdItem, prod->sourceRange());
    }

    if (randJoin && prods.size() < 2) {
        SourceRange range = randJoin->sourceRange();
        if (!prods.empty())
            range = SourceRange{range.start(), prods.back()->getLastToken().range().end()};

        addDiag(diag::RandJoinNotEnough, range);
    }

    RsWeightClauseSyntax* weightClause = nullptr;
    if (peek(TokenKind::ColonEquals)) {
        auto colonEqual = consume();
        auto& weight = parsePrimaryExpression(ExpressionOptions::DisallowVectors);

        RsCodeBlockSyntax* codeBlock = nullptr;
        if (peek(TokenKind::OpenBrace))
            codeBlock = &parseRsCodeBlock();

        weightClause = &factory.rsWeightClause(colonEqual, weight, codeBlock);
    }

    return factory.rsRule(randJoin, prods.copy(alloc), weightClause);
}